

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v8::detail::bigint::align(bigint *this,bigint *other)

{
  int iVar1;
  int index;
  int index_00;
  size_t sVar2;
  uint *puVar3;
  long in_RSI;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *in_RDI;
  int j;
  int i;
  int num_bigits;
  int exp_difference;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar4;
  
  iVar1 = *(int *)&in_RDI[1].super_buffer<unsigned_int>._vptr_buffer - *(int *)(in_RSI + 0xa8);
  if (0 < iVar1) {
    sVar2 = buffer<unsigned_int>::size(&in_RDI->super_buffer<unsigned_int>);
    to_unsigned<int>((int)sVar2 + iVar1);
    basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::resize
              (in_RDI,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    index = (int)sVar2 + -1;
    index_00 = index + iVar1;
    for (; -1 < index; index = index + -1) {
      puVar3 = buffer<unsigned_int>::operator[]<int>(&in_RDI->super_buffer<unsigned_int>,index);
      uVar4 = *puVar3;
      puVar3 = buffer<unsigned_int>::operator[]<int>(&in_RDI->super_buffer<unsigned_int>,index_00);
      *puVar3 = uVar4;
      index_00 = index_00 + -1;
    }
    buffer<unsigned_int>::data(&in_RDI->super_buffer<unsigned_int>);
    std::uninitialized_fill_n<unsigned_int*,int,int>
              ((uint *)CONCAT44(index,index_00),0,(int *)in_RDI);
    *(int *)&in_RDI[1].super_buffer<unsigned_int>._vptr_buffer =
         *(int *)&in_RDI[1].super_buffer<unsigned_int>._vptr_buffer - iVar1;
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void align(const bigint& other) {
    int exp_difference = exp_ - other.exp_;
    if (exp_difference <= 0) return;
    int num_bigits = static_cast<int>(bigits_.size());
    bigits_.resize(to_unsigned(num_bigits + exp_difference));
    for (int i = num_bigits - 1, j = i + exp_difference; i >= 0; --i, --j)
      bigits_[j] = bigits_[i];
    std::uninitialized_fill_n(bigits_.data(), exp_difference, 0);
    exp_ -= exp_difference;
  }